

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

void pnga_select_elem(Integer g_a,char *op,void *val,Integer *subscript)

{
  int iVar1;
  Integer IVar2;
  val_t vVar3;
  int contribute;
  long lVar4;
  long lVar5;
  bool bVar6;
  Integer ndim;
  Integer type;
  elem_info_t info;
  char *cptr;
  elem_info_t new_info;
  Integer hi [7];
  Integer lo [7];
  Integer ld [6];
  Integer dims [7];
  _iterator_hdl hdl_a;
  int local_4f8;
  undefined4 uStack_4f4;
  Integer local_4f0;
  Integer local_4e8;
  val_t local_4e0;
  long local_4d8 [7];
  val_t local_4a0;
  val_t vStack_498;
  val_t local_490;
  char *local_488;
  val_t *local_480;
  Integer *local_478;
  val_t local_470 [8];
  val_t local_430;
  val_t vStack_428;
  val_t local_420;
  Integer local_418 [8];
  Integer local_3d8 [8];
  Integer local_398 [6];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_4f0 = 0;
  bVar6 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar6) {
    pnga_sync();
  }
  contribute = 0;
  pnga_nodeid();
  pnga_check_handle(g_a,"ga_select_elem");
  iVar1 = strncmp(op,"min",3);
  if ((iVar1 != 0) && (iVar1 = strncmp(op,"max",3), iVar1 != 0)) {
    pnga_error("operator not recognized",0);
  }
  pnga_inquire(g_a,&local_4e8,(Integer *)&local_4f8,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar1 = pnga_local_iterator_next(&local_330,local_3d8,local_418,&local_488,local_398);
  if (iVar1 != 0) {
    bVar6 = false;
    local_480 = (val_t *)val;
    local_478 = subscript;
    do {
      lVar5 = CONCAT44(uStack_4f4,local_4f8);
      lVar4 = (local_418[lVar5 + -1] - local_3d8[lVar5 + -1]) + 1;
      if (1 < lVar5) {
        lVar5 = 0;
        do {
          if (local_398[lVar5] != (local_418[lVar5] - local_3d8[lVar5]) + 1) {
            pnga_error("layout problem",lVar5);
          }
          lVar4 = lVar4 * ((local_418[lVar5] - local_3d8[lVar5]) + 1);
          lVar5 = lVar5 + 1;
        } while (lVar5 < CONCAT44(uStack_4f4,local_4f8) + -1);
      }
      if (bVar6) {
        snga_select_elem(local_4e8,op,local_488,lVar4,(elem_info_t *)local_470,&local_4f0);
        switch(local_4e8) {
        case 0x3e9:
          iVar1 = strncmp(op,"min",3);
          if (iVar1 == 0) {
            if ((int)local_470[0]._0_4_ < local_4e0.ival) goto LAB_0013efb5;
          }
          else if (local_4e0.ival < (int)local_470[0]._0_4_) {
LAB_0013efb5:
            local_4e0.fval = (float)local_470[0]._0_4_;
            vVar3 = local_4e0;
            goto LAB_0013efd4;
          }
          break;
        case 0x3ea:
        case 0x3f8:
          iVar1 = strncmp(op,"min",3);
          vVar3.lval._4_4_ = local_470[0].lval._4_4_;
          vVar3.fval = (float)local_470[0]._0_4_;
          if (iVar1 == 0) {
            if (vVar3.lval < local_4e0.lval) goto LAB_0013efd4;
          }
          else if (local_4e0.lval < vVar3.lval) {
LAB_0013efd4:
            local_4e0 = vVar3;
            if (0 < CONCAT44(uStack_4f4,local_4f8)) {
              lVar5 = 0;
              IVar2 = local_4f0;
              do {
                lVar4 = (long)(((ulong)(uint)((int)local_418[lVar5] - (int)local_3d8[lVar5]) << 0x20
                               ) + 0x100000000) >> 0x20;
                local_4f0 = IVar2 / lVar4;
                local_4d8[lVar5] = IVar2 % lVar4 + local_3d8[lVar5];
                lVar5 = lVar5 + 1;
                IVar2 = local_4f0;
              } while (CONCAT44(uStack_4f4,local_4f8) != lVar5);
            }
          }
          break;
        case 0x3eb:
          iVar1 = strncmp(op,"min",3);
          if (iVar1 == 0) {
            if ((float)local_470[0]._0_4_ < local_4e0.fval) goto LAB_0013efc0;
          }
          else if (local_4e0.fval < (float)local_470[0]._0_4_) {
LAB_0013efc0:
            local_4e0.fval = (float)local_470[0]._0_4_;
            vVar3 = local_4e0;
            goto LAB_0013efd4;
          }
          break;
        case 0x3ec:
          iVar1 = strncmp(op,"min",3);
          vVar3.lval._4_4_ = local_470[0].lval._4_4_;
          vVar3.fval = (float)local_470[0]._0_4_;
          if (iVar1 == 0) {
            if (vVar3.dval < local_4e0.dval) goto LAB_0013efd4;
          }
          else if (local_4e0.dval < vVar3.dval) goto LAB_0013efd4;
          break;
        case 0x3ee:
          iVar1 = strncmp(op,"min",3);
          if (iVar1 == 0) {
            if ((float)local_470[0]._0_4_ < local_4e0.fval) goto LAB_0013ef77;
          }
          else if (local_4e0.fval < (float)local_470[0]._0_4_) {
LAB_0013ef77:
            local_4e0.fval = (float)local_470[0]._0_4_;
            local_490 = local_420;
            vVar3 = local_4e0;
            goto LAB_0013efd4;
          }
          break;
        case 0x3ef:
          iVar1 = strncmp(op,"min",3);
          vVar3.lval._4_4_ = local_470[0].lval._4_4_;
          vVar3.fval = (float)local_470[0]._0_4_;
          if (iVar1 == 0) {
            if (vVar3.dval < local_4e0.dval) goto LAB_0013ef96;
          }
          else if (local_4e0.dval < vVar3.dval) {
LAB_0013ef96:
            local_4a0 = local_430;
            vStack_498 = vStack_428;
            goto LAB_0013efd4;
          }
        }
      }
      else {
        snga_select_elem(local_4e8,op,local_488,lVar4,(elem_info_t *)&local_4e0,&local_4f0);
        if (0 < CONCAT44(uStack_4f4,local_4f8)) {
          lVar5 = 0;
          IVar2 = local_4f0;
          do {
            lVar4 = (long)(((ulong)(uint)((int)local_418[lVar5] - (int)local_3d8[lVar5]) << 0x20) +
                          0x100000000) >> 0x20;
            local_4f0 = IVar2 / lVar4;
            local_4d8[lVar5] = IVar2 % lVar4 + local_3d8[lVar5];
            lVar5 = lVar5 + 1;
            IVar2 = local_4f0;
          } while (CONCAT44(uStack_4f4,local_4f8) != lVar5);
        }
      }
      iVar1 = pnga_local_iterator_next(&local_330,local_3d8,local_418,&local_488,local_398);
      bVar6 = true;
    } while (iVar1 != 0);
    contribute = 1;
    val = local_480;
    subscript = local_478;
  }
  switch(local_4e8) {
  case 0x3e9:
    armci_msg_sel_scope(0x14d,&local_4e0,local_4f8 * 8 + 8,op,-99,contribute);
    *(int *)val = local_4e0.ival;
    break;
  case 0x3ea:
    iVar1 = -0x65;
    goto LAB_0013f192;
  case 0x3eb:
    armci_msg_sel_scope(0x14d,&local_4e0,local_4f8 * 8 + 8,op,-0x132,contribute);
    *(int *)val = local_4e0.ival;
    break;
  case 0x3ec:
    armci_msg_sel_scope(0x14d,&local_4e0,local_4f8 * 8 + 8,op,-0x133,contribute);
    *(val_t *)val = local_4e0;
    break;
  case 0x3ed:
switchD_0013f082_caseD_3ed:
    armci_msg_sel_scope(0x14d,&local_4e0,0x58,op,-0x133,contribute);
    *(val_t *)val = local_4a0;
    *(val_t *)((long)val + 8) = vStack_498;
    break;
  case 0x3ee:
    armci_msg_sel_scope(0x14d,&local_4e0,0x58,op,-0x132,contribute);
    vVar3 = local_490;
    goto LAB_0013f19d;
  default:
    if (local_4e8 != 0x3f8) goto switchD_0013f082_caseD_3ed;
    iVar1 = -0x66;
LAB_0013f192:
    armci_msg_sel_scope(0x14d,&local_4e0,local_4f8 * 8 + 8,op,iVar1,contribute);
    vVar3 = local_4e0;
LAB_0013f19d:
    *(val_t *)val = vVar3;
  }
  if (0 < CONCAT44(uStack_4f4,local_4f8)) {
    memcpy(subscript,local_4d8,CONCAT44(uStack_4f4,local_4f8) << 3);
  }
  return;
}

Assistant:

void pnga_select_elem(Integer g_a, char* op, void* val, Integer *subscript)
{
  Integer ndim, type, me, elems, ind=0, i;
  Integer lo[MAXDIM],hi[MAXDIM],dims[MAXDIM],ld[MAXDIM-1];
  elem_info_t info, new_info;
  Integer num_blocks;
  int     participate=0;
  int local_sync_begin;
  void *ptr;
  char *cptr;
  _iterator_hdl hdl_a;
  Integer first_pass;

  local_sync_begin = _ga_sync_begin; 
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  me = pnga_nodeid();

  pnga_check_handle(g_a, "ga_select_elem");

  if (strncmp(op,"min",3) == 0);
  else if (strncmp(op,"max",3) == 0);
  else pnga_error("operator not recognized",0);

  pnga_inquire(g_a, &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);


  first_pass = 1;
  pnga_local_iterator_init(g_a, &hdl_a);
  while (pnga_local_iterator_next(&hdl_a, lo, hi, &cptr, ld)) {
    Integer update;
    GET_ELEMS(ndim,lo,hi,ld,&elems);
    participate =1;
    ptr = (void*)cptr;

    if (first_pass) {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } else {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &new_info, &ind);

      /* compare with old block */
      snga_compare_elem(type,op, &new_info, &info, &update);
      /* determine element subscript in the ndim-array */
      if (update) {
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      }
    }
    first_pass = 0;
  }
#if 0
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, lo, hi);

    if ( lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      /******************* calculate local result ************************/
      void    *ptr;
      pnga_access_ptr(g_a, lo, hi, &ptr, ld);
      GET_ELEMS(ndim,lo,hi,ld,&elems);
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release(g_a, lo, hi);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } 
  } else {
    void *ptr;
    Integer j, offset, jtot, upper;
    Integer nproc = pnga_nnodes();
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    if (elems > 0) {
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release_block_segment(g_a, me);

      /* convert local index back into a global array index */
      if (!pnga_uses_proc_grid(g_a)) {
        offset = 0;
        for (i=me; i<num_blocks; i += nproc) {
          pnga_distribution(g_a, i, lo, hi);
          jtot = 1;
          for (j=0; j<ndim; j++) {
            jtot *= (hi[j]-lo[j]+1);
          }
          upper = offset + jtot;
          if (ind >= offset && ind < upper) {
            break;
          }  else {
            offset += jtot;
          }
        }
        /* determine element subscript in the ndim-array */
        ind -= offset;
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      } else {
        Integer stride[MAXDIM], index[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        Integer proc_index[MAXDIM], topology[MAXDIM];
        Integer l_index[MAXDIM];
        Integer min, max;
        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_grid(g_a, topology);
        if (!pnga_uses_irreg_proc_grid(g_a)) {
          pnga_get_block_info(g_a, blocks, block_dims);
          /* figure out strides for locally held block of data */
          for (i=0; i<ndim; i++) {
            stride[i] = 0;
            for (j=proc_index[i]; j<blocks[i]; j += topology[i]) {
              min = j*block_dims[i] + 1;
              max = (j+1)*block_dims[i];
              if (max > dims[i])
                max = dims[i];
              stride[i] += (max - min + 1);
            }
          }
          /* use strides to figure out local index */
          l_index[0] = ind%stride[0];
          for (i=1; i<ndim; i++) {
            ind = (ind-l_index[i-1])/stride[i-1];
            l_index[i] = ind%stride[i];
          }
          /* figure out block index for block holding data element */
          for (i=0; i<ndim; i++) {
            index[i] = l_index[i]/block_dims[i];
          }
          for (i=0; i<ndim; i++) {
            lo[i] = (topology[i]*index[i] + proc_index[i])*block_dims[i];
            info.subscr[i] = l_index[i]%block_dims[i] + lo[i];
          }
        } else {
        }
      }
    }
  }
#endif
  /* calculate global result */
  if(type==C_INT){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_INT,participate);
    *(int*)val = (int)info.v.ival;
  }else if(type==C_LONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG,participate);
    *(long*)val = info.v.lval;
  }else if(type==C_LONGLONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG_LONG,participate);
    *(long long*)val = info.v.llval;
  }else if(type==C_DBL){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoublePrecision*)val = info.v.dval;
  }else if(type==C_FLOAT){
    int size = sizeof(double) + sizeof(Integer)*ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(float*)val = info.v.fval;       
  }else if(type==C_SCPL){
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(SingleComplex*)val = info.extra2;
  }else{
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoubleComplex*)val = info.extra;
  }

  for(i = 0; i < ndim; i++) subscript[i]= info.subscr[i];
}